

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O2

rtaudio_device_info_t *
rtaudio_get_device_info(rtaudio_device_info_t *__return_storage_ptr__,rtaudio_t audio,uint id)

{
  uint uVar1;
  ulong uVar2;
  DeviceInfo info;
  DeviceInfo local_80;
  
  uVar1 = 0;
  memset(__return_storage_ptr__,0,0x268);
  audio->errtype = 0;
  RtAudio::getDeviceInfo(&local_80,audio->audio,id);
  if (audio->errtype == 0) {
    __return_storage_ptr__->id = local_80.ID;
    __return_storage_ptr__->output_channels = local_80.outputChannels;
    __return_storage_ptr__->input_channels = local_80.inputChannels;
    __return_storage_ptr__->duplex_channels = local_80.duplexChannels;
    __return_storage_ptr__->is_default_output = (uint)local_80.isDefaultOutput;
    __return_storage_ptr__->is_default_input = (uint)local_80.isDefaultInput;
    __return_storage_ptr__->native_formats = local_80.nativeFormats;
    __return_storage_ptr__->preferred_sample_rate = local_80.preferredSampleRate;
    strncpy(__return_storage_ptr__->name,local_80.name._M_dataplus._M_p,0x1ff);
    for (; uVar2 = (ulong)uVar1,
        uVar2 < (ulong)((long)local_80.sampleRates.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_80.sampleRates.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
      if (uVar1 < 0x10) {
        __return_storage_ptr__->sample_rates[uVar2] =
             local_80.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar2];
      }
    }
  }
  RtAudio::DeviceInfo::~DeviceInfo(&local_80);
  return __return_storage_ptr__;
}

Assistant:

rtaudio_device_info_t rtaudio_get_device_info(rtaudio_t audio, unsigned int id) {
  rtaudio_device_info_t result;
  std::memset(&result, 0, sizeof(result));

  audio->errtype = RTAUDIO_ERROR_NONE;
  RtAudio::DeviceInfo info = audio->audio->getDeviceInfo(id);
  if (audio->errtype != RTAUDIO_ERROR_NONE)
      return result;

  result.id = info.ID;
  result.output_channels = info.outputChannels;
  result.input_channels = info.inputChannels;
  result.duplex_channels = info.duplexChannels;
  result.is_default_output = info.isDefaultOutput;
  result.is_default_input = info.isDefaultInput;
  result.native_formats = info.nativeFormats;
  result.preferred_sample_rate = info.preferredSampleRate;
  strncpy(result.name, info.name.c_str(), sizeof(result.name) - 1);
  for (unsigned int j = 0; j < info.sampleRates.size(); j++) {
    if (j < sizeof(result.sample_rates) / sizeof(result.sample_rates[0])) {
      result.sample_rates[j] = info.sampleRates[j];
    }
  }
  return result;
}